

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall Session::OnMessage(Session *this,Handle *handle,BufferPtr *data,uint32_t param_3)

{
  element_type *peVar1;
  element_type *peVar2;
  uint uVar3;
  int iVar4;
  char buff [65535];
  undefined1 auStack_10018 [65536];
  
  this->_messages_read = this->_messages_read + 1;
  uVar3 = (*((data->super___shared_ptr<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Buffer[8])();
  this->_bytes_read = this->_bytes_read + (ulong)uVar3;
  while( true ) {
    iVar4 = (*((data->super___shared_ptr<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              _vptr_Buffer[8])();
    if (iVar4 == 0) break;
    peVar1 = (data->super___shared_ptr<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar3 = (*peVar1->_vptr_Buffer[3])(peVar1,auStack_10018,0xffff);
    peVar2 = (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar2->_vptr_CNSocket[5])(peVar2,auStack_10018,(ulong)uVar3);
  }
  return;
}

Assistant:

void OnMessage(cppnet::Handle handle, cppnet::BufferPtr data, uint32_t) {
       char buff[65535];
       ++_messages_read;

       uint32_t len_get = data->GetCanReadLength();
       _bytes_read += len_get;
       while (data->GetCanReadLength()) {
           uint32_t ret = data->Read(buff, 65535);
           handle->Write(buff, ret);
       }
    }